

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

QRect __thiscall
QTreeViewPrivate::intersectedRect
          (QTreeViewPrivate *this,QRect rect,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  Representation RVar1;
  QAbstractItemModel *pQVar2;
  Data *pDVar3;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_00;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *pDVar4;
  int iVar5;
  Representation RVar6;
  char cVar7;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar8;
  byte bVar9;
  Representation RVar10;
  int iVar11;
  int logicalIndex;
  int iVar12;
  long in_FS_OFFSET;
  bool bVar13;
  bool bVar14;
  Bucket BVar15;
  QRect QVar16;
  undefined1 local_e8 [12];
  Representation RStack_dc;
  QPersistentModelIndex local_d0;
  QRect local_c8;
  QModelIndex local_b8;
  QRect local_98;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QRect local_70;
  QPersistentModelIndex local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_70._8_8_ = rect._8_8_;
  local_70._0_8_ = rect._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (topLeft->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_88 = (undefined1 *)0xffffffffffffffff;
    puStack_80 = (undefined1 *)0x0;
    local_78 = (undefined1 *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar2 + 0x68))(&local_88,pQVar2,topLeft);
  }
  if (((this->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                             .super_QFramePrivate.super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  local_98 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  if (topLeft->r <= bottomRight->r) {
    iVar5 = -0x80000000;
    RVar10.m_i = 0x7fffffff;
    iVar11 = topLeft->r;
    local_98 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    do {
      local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.r = -0x55555556;
      local_b8.c = -0x55555556;
      local_b8.i._0_4_ = 0xaaaaaaaa;
      local_b8.i._4_4_ = 0xaaaaaaaa;
      pQVar2 = (this->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar2 + 0x60))(&local_b8,pQVar2,iVar11,0,&local_88);
      pDVar3 = (this->hiddenIndexes).q_hash.d;
      if ((pDVar3 == (Data *)0x0) || (pDVar3->size == 0)) {
LAB_005aca71:
        local_c8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
        RVar6.m_i = iVar5;
        if (RVar10.m_i == 0x7fffffff) {
          pDVar3 = (this->spanningIndexes).q_hash.d;
          if (pDVar3 == (Data *)0x0) {
            bVar13 = true;
          }
          else {
            bVar13 = pDVar3->size == 0;
          }
          if (bVar13) {
            bVar14 = false;
          }
          else {
            QPersistentModelIndex::QPersistentModelIndex(&local_d0,&local_b8);
            pDVar4 = (this->spanningIndexes).q_hash.d;
            if (pDVar4 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0)
            {
              bVar14 = false;
            }
            else {
              pNVar8 = QHashPrivate::
                       Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                       findNode<QPersistentModelIndex>(pDVar4,&local_d0);
              bVar14 = pNVar8 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
            }
          }
          if (!bVar13) {
            QPersistentModelIndex::~QPersistentModelIndex(&local_d0);
          }
          if (bVar14) {
            local_c8 = visualRect(this,&local_b8,FullRow);
            cVar7 = QRect::intersects(&local_c8);
            bVar9 = 0;
            if (cVar7 == '\0') goto LAB_005acd31;
          }
          else {
            logicalIndex = topLeft->c;
            if (topLeft->c <= bottomRight->c) {
              do {
                bVar13 = QHeaderView::isSectionHidden(this->header,logicalIndex);
                if (!bVar13) {
                  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                  local_58 = &DAT_aaaaaaaaaaaaaaaa;
                  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
                  pQVar2 = (this->super_QAbstractItemViewPrivate).model;
                  (**(code **)(*(long *)pQVar2 + 0x60))
                            ((QModelIndex *)&local_58,pQVar2,iVar11,logicalIndex,&local_88);
                  stack0xffffffffffffff20 = &DAT_aaaaaaaaaaaaaaaa;
                  local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  _local_e8 = visualRect(this,(QModelIndex *)&local_58,SingleSection);
                  iVar12 = 7;
                  if (local_e8._4_4_ + -1 != RStack_dc.m_i ||
                      local_e8._8_4_.m_i != local_e8._0_4_.m_i + -1) {
                    if ((local_70.y2.m_i < (int)local_e8._4_4_) || (RStack_dc.m_i < local_70.y1.m_i)
                       ) {
                      iVar12 = 5;
                    }
                    else {
                      cVar7 = QRect::intersects((QRect *)local_e8);
                      if (cVar7 != '\0') {
                        local_c8 = (QRect)QRect::operator|(&local_c8,(QRect *)local_e8);
                        if (local_c8.x1.m_i.m_i < local_70.x1.m_i) {
                          iVar12 = 5;
                          if (local_70.x2.m_i < local_c8.x2.m_i) goto LAB_005accac;
                        }
                        iVar12 = 0;
                      }
                    }
                  }
LAB_005accac:
                  if ((iVar12 != 7) && (iVar12 != 0)) break;
                }
                bVar13 = logicalIndex < bottomRight->c;
                logicalIndex = logicalIndex + 1;
              } while (bVar13);
            }
            if (local_c8.x1.m_i <= local_c8.x2.m_i) {
              if (local_c8.y1.m_i <= local_c8.y2.m_i) {
                if (local_c8.x1.m_i < 0x7fffffff) {
                  RVar10.m_i = local_c8.x1.m_i;
                }
                RVar6.m_i = local_c8.x2.m_i;
                if (local_c8.x2.m_i < iVar5) {
                  RVar6.m_i = iVar5;
                }
              }
            }
          }
        }
        else {
          local_c8 = visualRect(this,&local_b8,FullRow);
          cVar7 = QRect::intersects(&local_c8);
          bVar9 = 0;
          if (cVar7 == '\0') goto LAB_005acd31;
          RVar1.m_i = local_c8.y1.m_i + -1 + local_c8.y2.m_i;
          local_c8.x1.m_i = RVar10.m_i;
          local_c8.x2.m_i = iVar5 + RVar10.m_i + -1;
          local_c8.y2.m_i = RVar1.m_i;
        }
        QVar16 = (QRect)QRect::operator|(&local_98,&local_c8);
        local_98 = QVar16;
        cVar7 = QRect::contains(&local_98,SUB81(&local_70,0));
        bVar9 = cVar7 * '\x02';
        iVar5 = RVar6.m_i;
      }
      else {
        local_48.ptr = local_b8.m.ptr;
        local_58 = (undefined1 *)CONCAT44(local_b8.c,local_b8.r);
        puStack_50 = (undefined1 *)CONCAT44(local_b8.i._4_4_,(undefined4)local_b8.i);
        this_00 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                    **)(*(long *)((this->super_QAbstractItemViewPrivate).model + 8) + 0x90);
        if (this_00 ==
            (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
             *)0x0) {
LAB_005aca0f:
          bVar13 = false;
        }
        else {
          BVar15 = QHashPrivate::
                   Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                   ::findBucket<QtPrivate::QModelIndexWrapper>
                             (this_00,(QModelIndexWrapper *)&local_58);
          if (BVar15.span[BVar15.index] == (Span)0xff) goto LAB_005aca0f;
          bVar13 = *(long *)(BVar15.span + 0x80) != 0;
        }
        if (bVar13) {
          QPersistentModelIndex::QPersistentModelIndex(&local_60,&local_b8);
          pDVar4 = (this->hiddenIndexes).q_hash.d;
          if (pDVar4 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0)
          goto LAB_005aca49;
          pNVar8 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                   findNode<QPersistentModelIndex>(pDVar4,&local_60);
          bVar14 = pNVar8 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
        }
        else {
LAB_005aca49:
          bVar14 = false;
        }
        if (bVar13) {
          QPersistentModelIndex::~QPersistentModelIndex(&local_60);
        }
        bVar9 = 0;
        if (!bVar14) goto LAB_005aca71;
      }
LAB_005acd31:
    } while (((bVar9 & 3) == 0) && (bVar13 = iVar11 < bottomRight->r, iVar11 = iVar11 + 1, bVar13));
  }
  QVar16 = (QRect)QRect::operator&(&local_70,&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return QVar16;
}

Assistant:

QRect QTreeViewPrivate::intersectedRect(const QRect rect, const QModelIndex &topLeft, const QModelIndex &bottomRight) const
{
    const auto parentIdx = topLeft.parent();
    executePostedLayout();
    QRect updateRect;
    int left = std::numeric_limits<int>::max();
    int right = std::numeric_limits<int>::min();
    for (int row = topLeft.row(); row <= bottomRight.row(); ++row) {
        const auto idxCol0 = model->index(row, 0, parentIdx);
        if (isRowHidden(idxCol0))
            continue;
        QRect rowRect;
        if (left != std::numeric_limits<int>::max()) {
            // we already know left and right boundary of the rect to update
            rowRect = visualRect(idxCol0, FullRow);
            if (!rowRect.intersects(rect))
                continue;
            rowRect = QRect(left, rowRect.top(), right, rowRect.bottom());
        } else if (!spanningIndexes.isEmpty() && spanningIndexes.contains(idxCol0)) {
            // isFirstColumnSpanned re-creates the child index so take a shortcut here
            // spans the whole row, therefore ask for FullRow instead for every cell
            rowRect = visualRect(idxCol0, FullRow);
            if (!rowRect.intersects(rect))
                continue;
        } else {
            for (int col = topLeft.column(); col <= bottomRight.column(); ++col) {
                if (header->isSectionHidden(col))
                    continue;
                const QModelIndex idx(model->index(row, col, parentIdx));
                const QRect idxRect = visualRect(idx, SingleSection);
                if (idxRect.isNull())
                    continue;
                // early exit when complete row is out of viewport
                if (idxRect.top() > rect.bottom() || idxRect.bottom() < rect.top())
                    break;
                if (!idxRect.intersects(rect))
                    continue;
                rowRect = rowRect.united(idxRect);
                if (rowRect.left() < rect.left() && rowRect.right() > rect.right())
                    break;
            }
            if (rowRect.isValid()) {
                left = std::min(left, rowRect.left());
                right = std::max(right, rowRect.right());
            }
        }
        updateRect = updateRect.united(rowRect);
        if (updateRect.contains(rect))  // already full rect covered?
            break;
    }
    return rect.intersected(updateRect);
}